

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  char **ppcVar13;
  char **ppcVar14;
  int i;
  uint local_a84;
  BuildCtx ctx_;
  char local_88 [88];
  
  ctx_.mode = ~BUILD_elfasm;
  ctx_.outname = "-";
  iVar10 = 1;
  pcVar12 = (char *)0xffffffffffffffff;
LAB_00106353:
  lVar6 = (long)iVar10;
  pcVar9 = argv[lVar6];
  if ((pcVar9 == (char *)0x0) || (*pcVar9 != '-')) goto LAB_0010640a;
  cVar1 = pcVar9[1];
  if (cVar1 == 'm') {
    if ((pcVar9[2] != '\0') || (pcVar9 = argv[iVar10 + 1], pcVar9 == (char *)0x0))
    goto LAB_00106d20;
    ppcVar13 = modenames;
    pcVar12 = (char *)0x0;
    while( true ) {
      if (pcVar12 == (char *)0xb) goto LAB_00106d20;
      iVar4 = strcmp(pcVar9,*ppcVar13);
      if (iVar4 == 0) break;
      pcVar12 = pcVar12 + 1;
      ppcVar13 = ppcVar13 + 1;
    }
    ctx_.mode = (BuildMode)pcVar12;
    pcVar9 = ctx_.outname;
LAB_001063e7:
    ctx_.outname = pcVar9;
    iVar10 = iVar10 + 2;
    goto LAB_00106353;
  }
  if (cVar1 == 'o') {
    if ((pcVar9[2] != '\0') || (pcVar9 = argv[iVar10 + 1], argv[iVar10 + 1] == (char *)0x0))
    goto LAB_00106d20;
    goto LAB_001063e7;
  }
  if (cVar1 != '\0') {
    if ((cVar1 != '-') || (pcVar9[2] != '\0')) goto LAB_00106d20;
    lVar6 = (long)(iVar10 + 1);
  }
LAB_0010640a:
  ctx_.args = argv + lVar6;
  if ((int)pcVar12 == -1) {
LAB_00106d20:
    usage();
LAB_00106d25:
    fprintf(_stderr,"Error: undefined global %s\n",pcVar12);
    iVar10 = 2;
    goto LAB_00106d42;
  }
  ctx_.nglob = 0x9e;
  ctx_.glob = (void **)calloc(1,0x4f0);
  ctx_.nreloc = 0;
  ppcVar13 = globnames;
  ctx_.globnames = globnames;
  ctx_.extnames = extnames;
  ctx_.relocsym = (char **)malloc(0x1e0);
  ctx_.nrelocsym = 0;
  for (lVar6 = 0; lVar6 != 0xf0; lVar6 = lVar6 + 4) {
    *(undefined4 *)((long)relocmap + lVar6) = 0xffffffff;
  }
  ctx_.dasm_ident = "DynASM 1.5.0";
  ctx_.dasm_arch = "x86";
  dasm_init(&ctx_,2);
  dasm_setupglobal(&ctx_,ctx_.glob,ctx_.nglob);
  dasm_setup(&ctx_,build_actionlist);
  build_backend(&ctx_);
  ctx_.npc = 0x61;
  dasm_checkstep(&ctx_,-1);
  uVar5 = dasm_link(&ctx_,&ctx_.codesz);
  if (uVar5 != 0) {
LAB_00106d00:
    fprintf(_stderr,"Error: DASM error %08x\n",(ulong)uVar5);
    return 1;
  }
  ctx_.code = (uint8_t *)malloc(CONCAT44(ctx_.codesz._4_4_,(int32_t)ctx_.codesz));
  uVar5 = dasm_encode(&ctx_,ctx_.code);
  if (uVar5 != 0) goto LAB_00106d00;
  ctx_.beginsym = sym_decorate(&ctx_,"","lj_vm_asm_begin");
  uVar11 = (ulong)ctx_.npc;
  ctx_.sym = (BuildSym *)malloc((long)(ctx_.nglob + ctx_.npc + 1) << 4);
  ctx_.nsym = 0;
  ctx_.bc_ofs = (int32_t *)malloc(uVar11 << 2);
  ppcVar14 = bc_names;
  for (lVar6 = 0; lVar6 < (int)uVar11; lVar6 = lVar6 + 1) {
    iVar10 = dasm_getpclabel(&ctx_,(uint)lVar6);
    if (iVar10 < 0) {
      uVar5 = (uint)lVar6 | 0x22000000;
      goto LAB_00106d00;
    }
    ctx_.bc_ofs[lVar6] = iVar10;
    sym_insert(&ctx_,iVar10,"lj_BC_",*ppcVar14);
    uVar11 = (ulong)(uint)ctx_.npc;
    ppcVar14 = ppcVar14 + 1;
  }
  for (lVar6 = 0; lVar6 < ctx_.nglob; lVar6 = lVar6 + 1) {
    pcVar12 = *ppcVar13;
    sVar7 = strlen(pcVar12);
    if (ctx_.glob[lVar6] == (void *)0x0) goto LAB_00106d25;
    iVar10 = (int)sVar7;
    if (((iVar10 < 2) || (pcVar12[iVar10 - 2] != '_')) || (pcVar12[iVar10 - 1] != 'Z')) {
      sym_insert(&ctx_,(int)ctx_.glob[lVar6] - (int)ctx_.code,"lj_",pcVar12);
    }
    ppcVar13 = ppcVar13 + 1;
  }
  sym_insert(&ctx_,(int32_t)ctx_.codesz,"","");
  ctx_.nsym = ctx_.nsym + -1;
  dasm_free(&ctx_);
  pcVar12 = "w";
  if (ctx_.mode - BUILD_peobj < 2) {
    pcVar12 = "wb";
  }
  if ((*ctx_.outname == '-') && (ctx_.outname[1] == '\0')) {
    ctx_.fp = _stdout;
LAB_001066a5:
    switch(ctx_.mode) {
    case BUILD_elfasm:
    case BUILD_coffasm:
    case BUILD_machasm:
      emit_asm(&ctx_);
      if (ctx_.mode == BUILD_machasm) {
        fwrite("\t.section __TEXT,__eh_frame,coalesced,no_toc+strip_static_syms+live_support\n",0x4c
               ,1,(FILE *)ctx_.fp);
        fwrite("EH_frame1:\n\t.set L$set$x,LECIEX-LSCIEX\n\t.long L$set$x\nLSCIEX:\n\t.long 0\n\t.byte 0x1\n\t.ascii \"zPR\\0\"\n\t.byte 0x1\n\t.byte 128-8\n\t.byte 0x10\n\t.byte 6\n\t.byte 0x9b\n\t.long _lj_err_unwind_dwarf+4@GOTPCREL\n\t.byte 0x1b\n\t.byte 0xc\n\t.byte 0x7\n\t.byte 8\n\t.byte 0x80+0x10\n\t.byte 0x1\n\t.align 3\nLECIEX:\n\n"
               ,0x11c,1,(FILE *)ctx_.fp);
        uVar11 = 0;
        local_a84 = 0;
LAB_0010683d:
        lVar6 = uVar11 << 4;
        do {
          if ((long)ctx_.nsym <= (long)uVar11) {
            if (local_a84 != 0) {
              fwrite("EH_frame2:\n\t.set L$set$y,LECIEY-LSCIEY\n\t.long L$set$y\nLSCIEY:\n\t.long 0\n\t.byte 0x1\n\t.ascii \"zR\\0\"\n\t.byte 0x1\n\t.byte 128-8\n\t.byte 0x10\n\t.byte 1\n\t.byte 0x1b\n\t.byte 0xc\n\t.byte 0x7\n\t.byte 8\n\t.byte 0x80+0x10\n\t.byte 0x1\n\t.align 3\nLECIEY:\n\n"
                     ,0xe8,1,(FILE *)ctx_.fp);
              fprintf((FILE *)ctx_.fp,
                      "_lj_vm_ffi_call.eh:\nLSFDEY:\n\t.set L$set$yy,LEFDEY-LASFDEY\n\t.long L$set$yy\nLASFDEY:\n\t.long LASFDEY-EH_frame2\n\t.long _lj_vm_ffi_call-.\n\t.long %d\n\t.byte 0\n\t.byte 0xe\n\t.byte 16\n\t.byte 0x86\n\t.byte 0x2\n\t.byte 0xd\n\t.byte 0x6\n\t.byte 0x83\n\t.byte 0x3\n\t.align 3\nLEFDEY:\n\n"
                      ,(ulong)local_a84);
            }
            pcVar12 = ".subsections_via_symbols\n";
            sVar7 = 0x19;
            goto LAB_00106bf8;
          }
          uVar5 = *(int *)((long)&ctx_.sym[1].ofs + lVar6) -
                  *(int *)((long)&(ctx_.sym)->ofs + lVar6);
          if (uVar5 != 0) {
            pcVar12 = *(char **)((long)&(ctx_.sym)->name + lVar6);
            iVar10 = strcmp(pcVar12,"_lj_vm_ffi_call");
            if (iVar10 == 0) goto LAB_001068a7;
            fprintf((FILE *)ctx_.fp,
                    "%s.eh:\nLSFDE%d:\n\t.set L$set$%d,LEFDE%d-LASFDE%d\n\t.long L$set$%d\nLASFDE%d:\n\t.long LASFDE%d-EH_frame1\n\t.long %s-.\n\t.long %d\n\t.byte 0\n\t.byte 0xe\n\t.byte %d\n\t.byte 0x86\n\t.byte 0x2\n\t.byte 0x83\n\t.byte 0x3\n\t.byte 0x8f\n\t.byte 0x4\n\t.byte 0x8e\n\t.byte 0x5\n\t.align 3\nLEFDE%d:\n\n"
                    ,pcVar12,uVar11 & 0xffffffff,uVar11 & 0xffffffff,uVar11 & 0xffffffff,uVar11,
                    uVar11,uVar11,uVar11,pcVar12,(ulong)uVar5,0x50,uVar11);
          }
          lVar6 = lVar6 + 0x10;
          uVar11 = uVar11 + 1;
        } while( true );
      }
      if (ctx_.mode == BUILD_elfasm) {
        uVar5 = *(int *)(ctx_.glob + 0x99) - (int)ctx_.code;
        fwrite("\t.section .debug_frame,\"\",@progbits\n",0x24,1,(FILE *)ctx_.fp);
        fwrite(".Lframe0:\n\t.long .LECIE0-.LSCIE0\n.LSCIE0:\n\t.long 0xffffffff\n\t.byte 0x1\n\t.string \"\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE0:\n\n"
               ,0xd2,1,(FILE *)ctx_.fp);
        fprintf((FILE *)ctx_.fp,
                ".LSFDE0:\n\t.long .LEFDE0-.LASFDE0\n.LASFDE0:\n\t.long .Lframe0\n\t.quad .Lbegin\n\t.quad %d\n\t.byte 0xe\n\t.uleb128 %d\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0x83\n\t.uleb128 0x3\n\t.byte 0x8f\n\t.uleb128 0x4\n\t.byte 0x8e\n\t.uleb128 0x5\n\t.align 8\n.LEFDE0:\n\n"
                ,(ulong)uVar5,0x50);
        fprintf((FILE *)ctx_.fp,
                ".LSFDE1:\n\t.long .LEFDE1-.LASFDE1\n.LASFDE1:\n\t.long .Lframe0\n\t.quad lj_vm_ffi_call\n\t.quad %d\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE1:\n\n"
                ,(ulong)((int32_t)ctx_.codesz - uVar5));
        fwrite("\t.section .eh_frame,\"a\",@progbits\n",0x22,1,(FILE *)ctx_.fp);
        fwrite(".Lframe1:\n\t.long .LECIE1-.LSCIE1\n.LSCIE1:\n\t.long 0\n\t.byte 0x1\n\t.string \"zPR\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.uleb128 6\n\t.byte 0x1b\n\t.long lj_err_unwind_dwarf-.\n\t.byte 0x1b\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE1:\n\n"
               ,0x10d,1,(FILE *)ctx_.fp);
        fprintf((FILE *)ctx_.fp,
                ".LSFDE2:\n\t.long .LEFDE2-.LASFDE2\n.LASFDE2:\n\t.long .LASFDE2-.Lframe1\n\t.long .Lbegin-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 %d\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0x83\n\t.uleb128 0x3\n\t.byte 0x8f\n\t.uleb128 0x4\n\t.byte 0x8e\n\t.uleb128 0x5\n\t.align 8\n.LEFDE2:\n\n"
                ,(ulong)uVar5,0x50);
        fwrite(".Lframe2:\n\t.long .LECIE2-.LSCIE2\n.LSCIE2:\n\t.long 0\n\t.byte 0x1\n\t.string \"zR\"\n\t.uleb128 0x1\n\t.sleb128 -8\n\t.byte 0x10\n\t.uleb128 1\n\t.byte 0x1b\n\t.byte 0xc\n\t.uleb128 0x7\n\t.uleb128 8\n\t.byte 0x80+0x10\n\t.uleb128 0x1\n\t.align 8\n.LECIE2:\n\n"
               ,0xe3,1,(FILE *)ctx_.fp);
        fprintf((FILE *)ctx_.fp,
                ".LSFDE3:\n\t.long .LEFDE3-.LASFDE3\n.LASFDE3:\n\t.long .LASFDE3-.Lframe2\n\t.long lj_vm_ffi_call-.\n\t.long %d\n\t.uleb128 0\n\t.byte 0xe\n\t.uleb128 16\n\t.byte 0x86\n\t.uleb128 0x2\n\t.byte 0xd\n\t.uleb128 0x6\n\t.byte 0x83\n\t.uleb128 0x3\n\t.align 8\n.LEFDE3:\n\n"
                ,(ulong)((int32_t)ctx_.codesz - uVar5));
      }
      break;
    case BUILD_peobj:
      emit_peobj(&ctx_);
      break;
    case BUILD_raw:
      owrite(&ctx_,ctx_.code,CONCAT44(ctx_.codesz._4_4_,(int32_t)ctx_.codesz));
      break;
    case BUILD_bcdef:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx_.fp);
      fwrite("LJ_DATADEF const uint16_t lj_bc_ofs[] = {\n",0x2a,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; lVar6 < ctx_.npc; lVar6 = lVar6 + 1) {
        if (lVar6 != 0) {
          fwrite(",\n",2,1,(FILE *)ctx_.fp);
        }
        fprintf((FILE *)ctx_.fp,"%d",(ulong)(uint)ctx_.bc_ofs[lVar6]);
      }
    case BUILD_ffdef:
    case BUILD_libdef:
    case BUILD_recdef:
      emit_lib(&ctx_);
      break;
    case BUILD_vmdef:
      fwrite("-- This is a generated file. DO NOT EDIT!\n\n",0x2b,1,(FILE *)ctx_.fp);
      fprintf((FILE *)ctx_.fp,
              "assert(require(\"jit\").version == \"%s\", \"LuaJIT core/library version mismatch\")\n\n"
              ,"LuaJIT 2.1.1741897244");
      fwrite("return {\n\n",10,1,(FILE *)ctx_.fp);
      fwrite("bcnames = \"",0xb,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; lVar6 != 0x308; lVar6 = lVar6 + 8) {
        fprintf((FILE *)ctx_.fp,"%-6s",*(undefined8 *)((long)bc_names + lVar6));
      }
      fwrite("\",\n\n",4,1,(FILE *)ctx_.fp);
      fwrite("irnames = \"",0xb,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; lVar6 != 0x328; lVar6 = lVar6 + 8) {
        fprintf((FILE *)ctx_.fp,"%-6s",*(undefined8 *)((long)ir_names + lVar6));
      }
      fwrite("\",\n\n",4,1,(FILE *)ctx_.fp);
      fwrite("irfpm = { [0]=",0xe,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; pFVar3 = ctx_.fp, lVar6 != 0x38; lVar6 = lVar6 + 8) {
        lower(local_88,*(char **)((long)irfpm_names + lVar6));
        fprintf((FILE *)pFVar3,"\"%s\", ",local_88);
      }
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      fwrite("irfield = { [0]=",0x10,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; lVar6 != 200; lVar6 = lVar6 + 8) {
        lower(local_88,*(char **)((long)irfield_names + lVar6));
        pcVar12 = strchr(local_88,0x5f);
        if (pcVar12 != (char *)0x0) {
          *pcVar12 = '.';
        }
        fprintf((FILE *)ctx_.fp,"\"%s\", ",local_88);
      }
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      fwrite("ircall = {\n[0]=",0xf,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; lVar6 != 0x388; lVar6 = lVar6 + 8) {
        fprintf((FILE *)ctx_.fp,"\"%s\",\n",*(undefined8 *)((long)ircall_names + lVar6));
      }
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      fwrite("traceerr = {\n[0]=",0x11,1,(FILE *)ctx_.fp);
      for (lVar6 = 0; lVar6 != 0x118; lVar6 = lVar6 + 8) {
        fprintf((FILE *)ctx_.fp,"\"%s\",\n",*(undefined8 *)((long)trace_errors + lVar6));
      }
      fwrite("},\n\n",4,1,(FILE *)ctx_.fp);
      emit_lib(&ctx_);
      pcVar12 = "}\n\n";
      sVar7 = 3;
LAB_00106bf8:
      fwrite(pcVar12,sVar7,1,(FILE *)ctx_.fp);
      break;
    case BUILD_folddef:
      emit_fold(&ctx_);
    }
    fflush((FILE *)ctx_.fp);
    pFVar3 = ctx_.fp;
    iVar10 = ferror((FILE *)ctx_.fp);
    pFVar2 = _stderr;
    if (iVar10 == 0) {
      fclose((FILE *)pFVar3);
      return 0;
    }
    piVar8 = __errno_location();
    pcVar12 = strerror(*piVar8);
    fprintf(pFVar2,"Error: cannot write to output file: %s\n",pcVar12);
  }
  else {
    ctx_.fp = (FILE *)fopen(ctx_.outname,pcVar12);
    pcVar12 = ctx_.outname;
    pFVar2 = _stderr;
    if ((FILE *)ctx_.fp != (FILE *)0x0) goto LAB_001066a5;
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    fprintf(pFVar2,"Error: cannot open output file \'%s\': %s\n",pcVar12,pcVar9);
  }
  iVar10 = 1;
LAB_00106d42:
  exit(iVar10);
LAB_001068a7:
  uVar11 = uVar11 + 1;
  local_a84 = uVar5;
  goto LAB_0010683d;
}

Assistant:

int main(int argc, char **argv)
{
  BuildCtx ctx_;
  BuildCtx *ctx = &ctx_;
  int status, binmode;

  if (sizeof(void *) != 4*LJ_32+8*LJ_64) {
    fprintf(stderr,"Error: pointer size mismatch in cross-build.\n");
    fprintf(stderr,"Try: make HOST_CC=\"gcc -m32\" CROSS=...\n\n");
    return 1;
  }

  UNUSED(argc);
  parseargs(ctx, argv);

  if ((status = build_code(ctx))) {
    fprintf(stderr,"Error: DASM error %08x\n", status);
    return 1;
  }

  switch (ctx->mode) {
  case BUILD_peobj:
  case BUILD_raw:
    binmode = 1;
    break;
  default:
    binmode = 0;
    break;
  }

  if (ctx->outname[0] == '-' && ctx->outname[1] == '\0') {
    ctx->fp = stdout;
#if defined(_WIN32)
    if (binmode)
      _setmode(_fileno(stdout), _O_BINARY);  /* Yuck. */
#endif
  } else if (!(ctx->fp = fopen(ctx->outname, binmode ? "wb" : "w"))) {
    fprintf(stderr, "Error: cannot open output file '%s': %s\n",
	    ctx->outname, strerror(errno));
    exit(1);
  }

  switch (ctx->mode) {
  case BUILD_elfasm:
  case BUILD_coffasm:
  case BUILD_machasm:
    emit_asm(ctx);
    emit_asm_debug(ctx);
    break;
  case BUILD_peobj:
    emit_peobj(ctx);
    break;
  case BUILD_raw:
    emit_raw(ctx);
    break;
  case BUILD_bcdef:
    emit_bcdef(ctx);
    emit_lib(ctx);
    break;
  case BUILD_vmdef:
    emit_vmdef(ctx);
    emit_lib(ctx);
    fprintf(ctx->fp, "}\n\n");
    break;
  case BUILD_ffdef:
  case BUILD_libdef:
  case BUILD_recdef:
    emit_lib(ctx);
    break;
  case BUILD_folddef:
    emit_fold(ctx);
    break;
  default:
    break;
  }

  fflush(ctx->fp);
  if (ferror(ctx->fp)) {
    fprintf(stderr, "Error: cannot write to output file: %s\n",
	    strerror(errno));
    exit(1);
  }
  fclose(ctx->fp);

  return 0;
}